

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

bool __thiscall
CorUnix::CSynchData::ReleaseFirstWaiter
          (CSynchData *this,CPalThread *pthrCurrent,bool *pfDelegated,bool fWorkerThread)

{
  DWORD dwObjectIndex;
  ThreadWaitInfo *ptwiWaitInfo_00;
  bool bVar1;
  bool bVar2;
  DWORD DVar3;
  bool bVar4;
  ObjectDomain OVar5;
  OwnershipSemantics OVar6;
  PAL_ERROR PVar7;
  CPalSynchronizationManager *this_00;
  DWORD *pWaitState;
  CObjectType *this_01;
  ThreadWakeupReason twrWakeupReason;
  bool bVar8;
  bool bVar9;
  WaitCompletionState local_94;
  bool local_81;
  bool fAbandoned;
  ThreadWaitInfo *ptwiWaitInfo;
  bool fMarkedForDelegatedObjectSingalingInProgress;
  bool fWaitAll;
  WaitCompletionState wcsWaitCompletionState;
  CPalSynchronizationManager *pSynchManager;
  _WaitingThreadsListNode *p_Stack_60;
  DWORD dwPid;
  WaitingThreadsListNode *pwtlnNextItem;
  WaitingThreadsListNode *pwtlnItem;
  SHMPTR shridNextItem;
  SHMPTR shridItem;
  DWORD dwObjIdx;
  DWORD *pdwWaitState;
  bool fDelegatedSignaling;
  bool fThreadAwakened;
  bool fSharedObject;
  bool fSharedSynchLock;
  PAL_ERROR palErr;
  bool fWorkerThread_local;
  bool *pfDelegated_local;
  CPalThread *pthrCurrent_local;
  CSynchData *this_local;
  
  bVar1 = false;
  OVar5 = GetObjectDomain(this);
  DVar3 = gPID;
  bVar8 = OVar5 != SharedObject;
  pdwWaitState._5_1_ = false;
  bVar2 = false;
  shridNextItem = 0;
  pwtlnItem = (WaitingThreadsListNode *)0x0;
  this_00 = CPalSynchronizationManager::GetInstance();
  *pfDelegated = false;
  if (bVar8) {
    pwtlnNextItem = GetWTLHeadPtr(this);
  }
  else {
    shridNextItem = GetWTLHeadShmPtr(this);
    pwtlnNextItem = (WaitingThreadsListNode *)SHMPtrToPtr(shridNextItem);
  }
  do {
    if (pwtlnNextItem == (WaitingThreadsListNode *)0x0) {
LAB_001852f7:
      if (bVar2) {
        *pfDelegated = true;
      }
      else if (fWorkerThread) {
        CPalSynchronizationManager::UnmarkTWListForDelegatedObjectSignalingInProgress(this);
      }
      if (bVar1 != false) {
        CPalSynchronizationManager::ReleaseSharedSynchLock(pthrCurrent);
      }
      return pdwWaitState._5_1_;
    }
    bVar9 = (pwtlnNextItem->dwFlags & 2) != 0;
    pWaitState = (DWORD *)SHMPtrToPtr(pwtlnNextItem->shridWaitingState);
    if (bVar8) {
      p_Stack_60 = (pwtlnNextItem->ptrNext).ptr;
    }
    else {
      pwtlnItem = (pwtlnNextItem->ptrNext).ptr;
      p_Stack_60 = (_WaitingThreadsListNode *)SHMPtrToPtr((SHMPTR)pwtlnItem);
    }
    if (bVar9) {
      if ((bVar8) && (pwtlnNextItem->dwProcessId != gPID)) {
        fprintf(_stderr,"] %s %s:%d","ReleaseFirstWaiter",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x477);
        fprintf(_stderr,"Expression: fSharedObject || pwtlnItem->dwProcessId == gPID\n");
      }
      if (((bVar1 == false) && (bVar8)) && (pwtlnNextItem->ptwiWaitInfo->wdWaitDomain != LocalWait))
      {
        CPalSynchronizationManager::AcquireSharedSynchLock(pthrCurrent);
        bVar1 = true;
      }
      if ((pwtlnNextItem->dwFlags & 4) == 0) {
        local_94 = IsRestOfWaitAllSatisfied(this,pwtlnNextItem);
      }
      else {
        local_94 = WaitIsNotSatisfied;
      }
      ptwiWaitInfo._4_4_ = local_94;
    }
    else {
      ptwiWaitInfo._4_4_ = WaitIsSatisfied;
    }
    if (ptwiWaitInfo._4_4_ == WaitIsSatisfied) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      bVar4 = CPalSynchronizationManager::InterlockedAwaken(pWaitState,false);
      if (bVar4) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        dwObjectIndex = pwtlnNextItem->dwObjIndex;
        if (DVar3 == pwtlnNextItem->dwProcessId) {
          ptwiWaitInfo_00 = pwtlnNextItem->ptwiWaitInfo;
          local_81 = false;
          this_01 = GetObjectType(this);
          OVar6 = CObjectType::GetOwnershipSemantics(this_01);
          if (OVar6 == OwnershipTracked) {
            local_81 = IsAbandoned(this);
            PVar7 = AssignOwnershipToThread(this,pthrCurrent,ptwiWaitInfo_00->pthrOwner);
            if ((PVar7 != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
              abort();
            }
          }
          if (bVar9) {
            CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll
                      (pthrCurrent,ptwiWaitInfo_00->pthrOwner,pwtlnNextItem,this);
          }
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          bVar9 = true;
          if (bVar8) {
            bVar9 = bVar1;
          }
          CPalSynchronizationManager::UnRegisterWait(this_00,pthrCurrent,ptwiWaitInfo_00,bVar9);
          twrWakeupReason = WaitSucceeded;
          if (local_81 != false) {
            twrWakeupReason = MutexAbondoned;
          }
          PVar7 = CPalSynchronizationManager::WakeUpLocalThread
                            (pthrCurrent,ptwiWaitInfo_00->pthrOwner,twrWakeupReason,dwObjectIndex);
          if (PVar7 != 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            CPalThread::GetThreadId(ptwiWaitInfo_00->pthrOwner);
          }
        }
        else {
          if (bVar9) {
            fprintf(_stderr,"] %s %s:%d","ReleaseFirstWaiter",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                    ,0x4f2);
            fprintf(_stderr,
                    "Expression: !fWaitAll, Description: Control should never reach this point if target wait is a wait-all\n"
                   );
          }
          PVar7 = CPalSynchronizationManager::WakeUpRemoteThread(shridNextItem);
          if ((PVar7 != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
            abort();
          }
        }
        pdwWaitState._5_1_ = true;
        goto LAB_001852f7;
      }
    }
    else if (ptwiWaitInfo._4_4_ == WaitMayBeSatisfied) {
      if (!bVar9) {
        fprintf(_stderr,"] %s %s:%d","ReleaseFirstWaiter",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x518);
        fprintf(_stderr,
                "Expression: fWaitAll, Description: IsRestOfWaitAllSatisfied() apparently returned -1 on a normal (non wait all) wait\n"
               );
      }
      if (bVar8) {
        fprintf(_stderr,"] %s %s:%d","ReleaseFirstWaiter",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x51c);
        fprintf(_stderr,
                "Expression: fSharedObject, Description: About to delegate object signaling to a remote process, but the signaled object is actually local\n"
               );
      }
      PVar7 = CPalSynchronizationManager::DelegateSignalingToRemoteProcess
                        (pthrCurrent,pwtlnNextItem->dwProcessId,
                         (pwtlnNextItem->ptrOwnerObjSynchData).shrid);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if (PVar7 == 0) {
        pdwWaitState._5_1_ = true;
        bVar2 = true;
        goto LAB_001852f7;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    if (((fWorkerThread) && (bVar9)) && (DVar3 == pwtlnNextItem->dwProcessId)) {
      CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress
                (pthrCurrent,pwtlnNextItem);
    }
    shridNextItem = (SHMPTR)pwtlnItem;
    pwtlnNextItem = p_Stack_60;
  } while( true );
}

Assistant:

bool CSynchData::ReleaseFirstWaiter(
        CPalThread * pthrCurrent,
        bool * pfDelegated,
        bool fWorkerThread)
    {        
        PAL_ERROR palErr = NO_ERROR;
        bool fSharedSynchLock = false;
        bool fSharedObject = (SharedObject == GetObjectDomain());
        bool fThreadAwakened = false;
        bool fDelegatedSignaling = false;
        DWORD * pdwWaitState;
        DWORD dwObjIdx;
        SharedID shridItem = NULLSharedID, shridNextItem = NULLSharedID;
        WaitingThreadsListNode * pwtlnItem, * pwtlnNextItem;
        DWORD dwPid = gPID;
        CPalSynchronizationManager * pSynchManager = 
            CPalSynchronizationManager::GetInstance();

        VALIDATEOBJECT(this);

        *pfDelegated = false;

        if (fSharedObject)
        {
            shridItem = GetWTLHeadShmPtr();
            pwtlnItem = SharedIDToTypePointer(WaitingThreadsListNode, shridItem);
        }
        else
        {
            pwtlnItem = GetWTLHeadPtr();
        }
            
        while (pwtlnItem)
        {
            VALIDATEOBJECT(pwtlnItem);
            
            WaitCompletionState wcsWaitCompletionState;
            bool fWaitAll = (0 != (WTLN_FLAG_WAIT_ALL & pwtlnItem->dwFlags));
            pdwWaitState = SharedIDToTypePointer(DWORD, 
                pwtlnItem->shridWaitingState);           

            if (fSharedObject)
            {
                shridNextItem = pwtlnItem->ptrNext.shrid;
                pwtlnNextItem = SharedIDToTypePointer(WaitingThreadsListNode, 
                                                  shridNextItem);
            }
            else
            {
                pwtlnNextItem = pwtlnItem->ptrNext.ptr;
            }                    

            if (fWaitAll)
            {
                // Wait All: we need to find out whether the wait is satisfied, 
                // or it is not, or if that cannot be determined from within 
                // this process (WaitMayBeSatisfied); in this case we need to 
                // delegate the object signaling to the process hosting the 
                // thread that owns the current target WaitingThreadsListNode

                // If the target object is local (fSharedObject == false)
                // we're probably not holding the shared lock.
                // If the wait is not a LocalWait, it involves at least one
                // shared object. If that is the case, at this time we need 
                // to grab the shared lock.  In fact IsRestOfWaitAllSatisfied
                // and UnsignalRestOfLocalAwakeningWaitAll must be called 
                // atomically to prevent that another thread living
                // in a different process could race with us stealing the 
                // signaling from one of the objects involved in the wait-all.
                //
                // Note: pwtlnItem->ptwiWaitInfo is valid only if the target
                // wait originates in the current process. Anyway in the 
                // following 'if' we don't need to check that since we are
                // already making sure that the object is local (!fSharedObject).
                // If a wait involves at least one object local to this process, 
                // it can only be a wait performed by a thread in the current 
                // process, therefore pwtlnItem->ptwiWaitInfo is valid.

                _ASSERTE(fSharedObject || pwtlnItem->dwProcessId == gPID); 
                
                if (!fSharedSynchLock && !fSharedObject && 
                    LocalWait != pwtlnItem->ptwiWaitInfo->wdWaitDomain)
                {
                    CPalSynchronizationManager::AcquireSharedSynchLock(pthrCurrent);
                    fSharedSynchLock = true;
                }   

                // First check if the current target node is already marked for 
                // wait all check in progress, and in case skip it by setting
                // wcsWaitCompletionState to WaitIsNotSatisfied
                bool fMarkedForDelegatedObjectSingalingInProgress = 
                    (0 != (WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS & pwtlnItem->dwFlags));
                
                wcsWaitCompletionState = 
                    fMarkedForDelegatedObjectSingalingInProgress ? WaitIsNotSatisfied : 
                    IsRestOfWaitAllSatisfied(pwtlnItem);
            }
            else
            {
                // Normal Wait: the wait is satisfied by definition
                wcsWaitCompletionState = WaitIsSatisfied;
            }
            
            if (WaitIsSatisfied == wcsWaitCompletionState)
            {
                //
                // Target wait is satisfied
                //
                TRACE("Trying to switch wait state [%p] from WAIT/ALERTABLE "
                      "to ACTIVE for thread=%u\n", 
                      pdwWaitState, pwtlnItem->dwThreadId);
                
                if (CPalSynchronizationManager::InterlockedAwaken(pdwWaitState, FALSE))
                {
                    TRACE("Succeeded switching wait state [%p] from WAIT/ALERTABLE "
                          "to TWS_ACTIVE for trhead=%u\n", 
                          pdwWaitState, pwtlnItem->dwThreadId);

                    dwObjIdx = pwtlnItem->dwObjIndex;
                    
                    if (dwPid == pwtlnItem->dwProcessId)
                    {
                        ///////////////////////////
                        //
                        // Local Thread Awakening
                        //
                        ///////////////////////////
                        ThreadWaitInfo * ptwiWaitInfo = pwtlnItem->ptwiWaitInfo;
                        bool fAbandoned = false;

                        if (CObjectType::OwnershipTracked ==
                            GetObjectType()->GetOwnershipSemantics())
                        {
                            // Get the abandoned status before resetting it by
                            // assigning ownership to target thread
                            fAbandoned = IsAbandoned();
                            
                            // Assign ownership to target thread
                            // Note: This will cause both ownership count and
                            //       signal count to be greater than zero at the
                            //       same time; the signal count will be anyway
                            //       decremented immediately by the caller 
                            //       CsynchData::Signal
                            palErr = AssignOwnershipToThread(pthrCurrent,
                                                             ptwiWaitInfo->pthrOwner);
                            if (NO_ERROR != palErr)
                            {
                                ERROR("Synch Worker: AssignOwnershipToThread "
                                      "failed with error %u; ownership data on "
                                      "object with SynchData %p may be "
                                      "corrupted\n", palErr, this);
                            }
                        }

                        if (fWaitAll)
                        {
                            // Wait all satisfied: unsignal other objects 
                            // involved in the wait
                            CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll(
                                pthrCurrent,
                                ptwiWaitInfo->pthrOwner,
                                pwtlnItem,
                                this);
                        }                        

                        TRACE("Unregistering wait for thread %u and waking it up "
                              "[pdwWaitState=%p]\n", pwtlnItem->dwThreadId, 
                              pdwWaitState);
                        
                        // Unregister the wait
                        pSynchManager->UnRegisterWait(pthrCurrent, 
                                                      ptwiWaitInfo,
                                                      fSharedObject || fSharedSynchLock);

                        // After UnRegisterWait pwtlnItem is invalid
                        pwtlnItem = NULL; 
                                                
                        palErr = CPalSynchronizationManager::WakeUpLocalThread(
                            pthrCurrent, 
                            ptwiWaitInfo->pthrOwner, 
                            fAbandoned ? MutexAbondoned : WaitSucceeded,
                            dwObjIdx);
                        
                        if (NO_ERROR != palErr)
                        {
                            ERROR("Failed to wakeup local thread %#x: "
                                  "object signaling may be "
                                  "lost\n", ptwiWaitInfo->pthrOwner->GetThreadId());
                        }
                    }
                    else
                    {
                        ///////////////////////////
                        //
                        // Remote Thread Awakening
                        //
                        ///////////////////////////

                        // Note: if we are here, this cannot be a wait-all
                        _ASSERT_MSG(!fWaitAll, 
                                    "Control should never reach this point if "
                                    "target wait is a wait-all\n");

                        // Wake up remote thread
                        palErr = CPalSynchronizationManager::WakeUpRemoteThread(shridItem);

                        if (NO_ERROR != palErr)
                        {
                            ERROR("Failed to dispatch remote awakening cmd to "
                                  "worker thread in process pid=%d to wake up"
                                  "thread tid=%#x; object signaling may be "
                                  "lost\n", pwtlnItem->dwProcessId, 
                                  pwtlnItem->dwThreadId);
                        }
                    }

                    // A thread has been awakened
                    fThreadAwakened = true;

                    // break out of the while loop
                    break;
                }
            }
            else if (WaitMayBeSatisfied == wcsWaitCompletionState)
            {
                //////////////////////////////////////////
                //
                // Wait All with remote thread awakening
                //
                //////////////////////////////////////////
                
                //
                // We need to transfer the object signaling to the process
                // hosting the target waiter thread
                //                
                
                _ASSERT_MSG(fWaitAll,
                            "IsRestOfWaitAllSatisfied() apparently "
                            "returned -1 on a normal (non wait all) "
                            "wait\n");
                _ASSERT_MSG(fSharedObject,
                            "About to delegate object signaling to a remote "
                            "process, but the signaled object is actually "
                            "local\n");
                
                // Delegate object signaling to target process
                palErr = CPalSynchronizationManager::DelegateSignalingToRemoteProcess(
                    pthrCurrent,
                    pwtlnItem->dwProcessId,
                    pwtlnItem->ptrOwnerObjSynchData.shrid);

                TRACE("Delegating object signaling for SynchData shrid=%p\n",
                      (VOID *)pwtlnItem->ptrOwnerObjSynchData.shrid);
                
                if (NO_ERROR == palErr)
                {
                    // A remote thread will be awakened
                    // This will also cause the object to be unsignaled by the
                    // code calling ReleaseFirstWaiter before releasing the 
                    // synch locks, so no other WaitForMultipleObjects 
                    // involving the target object may race stealing this 
                    // particuklar object signaling 
                    fThreadAwakened = true;

                    fDelegatedSignaling = true;                    
                    
                    // break out of the while loop
                    break;
                }
                else
                {
                    ERROR("Failed to delegate object signaling to remote "
                          "process %d. Looking for another waiter.\n",
                          pwtlnItem->dwProcessId);

                    // Go on: a different target waiter will be selected
                }
            }

            if (fWorkerThread && fWaitAll && (dwPid == pwtlnItem->dwProcessId))
            {
                // Mark the target wait for object signaling
                CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress(
                    pthrCurrent,
                    pwtlnItem);
            }

            // Go to the next item
            shridItem = shridNextItem;
            pwtlnItem = pwtlnNextItem;
        }

        if (fDelegatedSignaling)
        {            
            *pfDelegated = true;
        }
        else if (fWorkerThread)
        {
            // Reset 'delegated object signaling in progress' flags
            CPalSynchronizationManager::UnmarkTWListForDelegatedObjectSignalingInProgress(
                this);
        }

        if (fSharedSynchLock)
        {
            CPalSynchronizationManager::ReleaseSharedSynchLock(pthrCurrent);
        }
        return fThreadAwakened;   
    }